

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_save.c
# Opt level: O0

int smf_append(smf_t *smf,void *buffer,int buffer_length)

{
  void *__dest;
  void *dest;
  int buffer_length_local;
  void *buffer_local;
  smf_t *smf_local;
  
  __dest = smf_extend(smf,buffer_length);
  if (__dest == (void *)0x0) {
    g_log("libsmf",8,"Cannot extend track buffer.");
    smf_local._4_4_ = -1;
  }
  else {
    memcpy(__dest,buffer,(long)buffer_length);
    smf_local._4_4_ = 0;
  }
  return smf_local._4_4_;
}

Assistant:

static int
smf_append(smf_t *smf, const void *buffer, const int buffer_length)
{
	void *dest;

	dest = smf_extend(smf, buffer_length);
	if (dest == NULL) {
		g_critical("Cannot extend track buffer.");
		return (-1);
	}

	memcpy(dest, buffer, buffer_length);

	return (0);
}